

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

bool __thiscall BamTools::BamAlignment::GetTagType(BamAlignment *this,string *tag,char *type)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  byte bVar4;
  char *pTagData;
  uint numBytesParsed;
  uint tagDataLength;
  string message;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pointer local_40;
  uint local_38;
  uint local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((this->SupportData).HasCoreOnly == false) &&
     (sVar2 = (this->TagData)._M_string_length, sVar2 != 0)) {
    local_40 = (this->TagData)._M_dataplus._M_p;
    local_34 = (uint)sVar2;
    local_38 = 0;
    bVar3 = FindTag(this,tag,&local_40,&local_34,&local_38);
    if (bVar3) {
      cVar1 = local_40[-1];
      *type = cVar1;
      bVar4 = cVar1 + 0xbf;
      if ((bVar4 < 0x33) && ((0x4012402040187U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
        return true;
      }
      std::__cxx11::string::string((string *)&local_60,"invalid tag type: ",&local_61);
      std::operator+(&local_30,&local_60,*type);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string((string *)&local_60,"BamAlignment::GetTagType",&local_61);
      SetErrorString(this,&local_60,&local_30);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return false;
}

Assistant:

bool BamAlignment::GetTagType(const std::string& tag, char& type) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // if tag not found, return failure
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // otherwise, retrieve & validate tag type code
    type = *(pTagData - 1);
    switch (type) {
        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
        case (Constants::BAM_TAG_TYPE_ARRAY):
            return true;

        // unknown tag type
        default:
            const std::string message = std::string("invalid tag type: ") + type;
            SetErrorString("BamAlignment::GetTagType", message);
            return false;
    }
}